

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O0

void virtio_legacy_send_command(virtio_device *dev,void *cmd,size_t cmd_len)

{
  uint *puVar1;
  pkt_buf *buf_00;
  uint *puVar2;
  undefined8 *puVar3;
  ulong in_RDX;
  char *in_RSI;
  long in_RDI;
  vring_used_elem *e;
  pkt_buf *buf;
  vring_desc *desc;
  uint16_t idx;
  virtqueue *vq;
  uint16_t in_stack_ffffffffffffff6e;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  ushort local_22;
  
  puVar1 = *(uint **)(in_RDI + 0x88);
  if (in_RDX < 2) {
    fprintf(_stderr,"[ERROR] %s:%d %s(): Command can not be shorter than control header\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x6b,"virtio_legacy_send_command");
    abort();
  }
  if (*in_RSI != '\0') {
    fprintf(_stderr,"[ERROR] %s:%d %s(): Command class is not supported\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x6e,"virtio_legacy_send_command");
    abort();
  }
  local_22 = 0;
  while (((uint)local_22 < *puVar1 &&
         (*(long *)(*(long *)(puVar1 + 2) + (ulong)local_22 * 0x10) != 0))) {
    local_22 = local_22 + 1;
  }
  if ((uint)local_22 == *puVar1) {
    fprintf(_stderr,"[ERROR] %s:%d %s(): command queue full\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x7b,"virtio_legacy_send_command");
    abort();
  }
  fprintf(_stderr,"[DEBUG] %s:%d %s(): Found free desc slot at %u (%u)\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
          0x7d,"virtio_legacy_send_command",(ulong)local_22,*puVar1);
  buf_00 = pkt_buf_alloc((mempool *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if (buf_00 == (pkt_buf *)0x0) {
    fprintf(_stderr,"[ERROR] %s:%d %s(): Control queue ran out of buffers\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x82,"virtio_legacy_send_command");
    abort();
  }
  memcpy(buf_00 + 1,in_RSI,in_RDX);
  *(pkt_buf **)(puVar1 + (ulong)local_22 * 2 + 0xe) = buf_00;
  *(undefined4 *)(*(long *)(puVar1 + 2) + (ulong)local_22 * 0x10 + 8) = 2;
  *(uintptr_t *)(*(long *)(puVar1 + 2) + (ulong)local_22 * 0x10) = buf_00->buf_addr_phy + 0x40;
  *(undefined2 *)(*(long *)(puVar1 + 2) + (ulong)local_22 * 0x10 + 0xc) = 1;
  *(ushort *)(*(long *)(puVar1 + 2) + (ulong)local_22 * 0x10 + 0xe) = local_22 + 1;
  *(int *)(*(long *)(puVar1 + 2) + (long)(int)(local_22 + 1) * 0x10 + 8) = (int)in_RDX + -3;
  *(uintptr_t *)(*(long *)(puVar1 + 2) + (long)(int)(local_22 + 1) * 0x10) =
       buf_00->buf_addr_phy + 0x42;
  *(undefined2 *)(*(long *)(puVar1 + 2) + (long)(int)(local_22 + 1) * 0x10 + 0xc) = 1;
  *(ushort *)(*(long *)(puVar1 + 2) + (long)(int)(local_22 + 1) * 0x10 + 0xe) = local_22 + 2;
  *(undefined4 *)(*(long *)(puVar1 + 2) + (long)(int)(local_22 + 2) * 0x10 + 8) = 1;
  *(uintptr_t *)(*(long *)(puVar1 + 2) + (long)(int)(local_22 + 2) * 0x10) =
       buf_00->buf_addr_phy + in_RDX + 0x3f;
  *(undefined2 *)(*(long *)(puVar1 + 2) + (long)(int)(local_22 + 2) * 0x10 + 0xc) = 2;
  *(undefined2 *)(*(long *)(puVar1 + 2) + (long)(int)(local_22 + 2) * 0x10 + 0xe) = 0;
  *(ushort *)
   (*(long *)(puVar1 + 4) + 4 + ((ulong)*(ushort *)(*(long *)(puVar1 + 4) + 2) % (ulong)*puVar1) * 2
   ) = local_22;
  *(short *)(*(long *)(puVar1 + 4) + 2) = *(short *)(*(long *)(puVar1 + 4) + 2) + 1;
  virtio_legacy_notify_queue
            ((virtio_device *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff6e);
  while ((short)puVar1[10] == *(short *)(*(long *)(puVar1 + 6) + 2)) {
    fprintf(_stderr,"[DEBUG] %s:%d %s(): Waiting...\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0xab,"virtio_legacy_send_command");
    usleep(100000);
  }
  *(short *)(puVar1 + 10) = (short)puVar1[10] + 1;
  puVar2 = (uint *)(*(long *)(puVar1 + 6) + 4 + (ulong)*(ushort *)(*(long *)(puVar1 + 6) + 2) * 8);
  fprintf(_stderr,"[DEBUG] %s:%d %s(): e %p: id %u len %u\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
          0xb1,"virtio_legacy_send_command",puVar2,*puVar2,puVar2[1]);
  if (*puVar2 == (uint)local_22) {
    if (*(pkt_buf **)(puVar1 + (ulong)local_22 * 2 + 0xe) == buf_00) {
      pkt_buf_free(buf_00);
      puVar3 = (undefined8 *)(*(long *)(puVar1 + 2) + (ulong)local_22 * 0x10);
      *puVar3 = 0;
      puVar3[1] = 0;
      puVar3 = (undefined8 *)(*(long *)(puVar1 + 2) + (long)(int)(local_22 + 1) * 0x10);
      *puVar3 = 0;
      puVar3[1] = 0;
      puVar3 = (undefined8 *)(*(long *)(puVar1 + 2) + (long)(int)(local_22 + 2) * 0x10);
      *puVar3 = 0;
      puVar3[1] = 0;
      return;
    }
    fprintf(_stderr,"[ERROR] %s:%d %s(): buffer differ\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0xb6,"virtio_legacy_send_command");
    abort();
  }
  fprintf(_stderr,"[ERROR] %s:%d %s(): Used buffer has different index as sent one\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
          0xb3,"virtio_legacy_send_command");
  abort();
}

Assistant:

static void virtio_legacy_send_command(struct virtio_device* dev, void* cmd, size_t cmd_len) {
	struct virtqueue* vq = dev->ctrl_queue;

	if (cmd_len < sizeof(struct virtio_net_ctrl_hdr)) {
		error("Command can not be shorter than control header");
	}
	if (((uint8_t*)cmd)[0] != VIRTIO_NET_CTRL_RX) {
		error("Command class is not supported");
	}

	_mm_mfence();
	// Find free desciptor slot
	uint16_t idx = 0;
	for (idx = 0; idx < vq->vring.num; ++idx) {
		struct vring_desc* desc = &vq->vring.desc[idx];
		if (desc->addr == 0) {
			break;
		}
	}
	if (idx == vq->vring.num) {
		error("command queue full");
	} else {
		debug("Found free desc slot at %u (%u)", idx, vq->vring.num);
	}

	struct pkt_buf* buf = pkt_buf_alloc(vq->mempool);
	if (!buf) {
		error("Control queue ran out of buffers");
	}
	memcpy(buf->data, cmd, cmd_len);
	vq->virtual_addresses[idx] = buf;

	/* The following descriptor setup kills QEMU, but should be allowed with VIRTIO_F_ANY_LAYOUT
	 * Error: kvm: virtio-net ctrl missing headers
	 * Version: QEMU emulator version 2.7.1 pve-qemu-kvm_2.7.1-4
	 */
	// All in one descriptor
	// vq->vring.desc[idx].len = cmd_len;
	// vq->vring.desc[idx].addr = buf->buf_addr_phy + offsetof(struct pkt_buf, data);
	// vq->vring.desc[idx].flags = VRING_DESC_F_WRITE;
	// vq->vring.desc[idx].next = 0;

	// Device-readable head: cmd header
	vq->vring.desc[idx].len = 2;
	vq->vring.desc[idx].addr = buf->buf_addr_phy + offsetof(struct pkt_buf, data);
	vq->vring.desc[idx].flags = VRING_DESC_F_NEXT;
	vq->vring.desc[idx].next = idx + 1;
	// Device-readable payload: data
	vq->vring.desc[idx + 1].len = cmd_len - 2 - 1; // Header and ack byte
	vq->vring.desc[idx + 1].addr = buf->buf_addr_phy + offsetof(struct pkt_buf, data) + 2;
	vq->vring.desc[idx + 1].flags = VRING_DESC_F_NEXT;
	vq->vring.desc[idx + 1].next = idx + 2;
	// Device-writable tail: ack flag
	vq->vring.desc[idx + 2].len = 1;
	vq->vring.desc[idx + 2].addr = buf->buf_addr_phy + offsetof(struct pkt_buf, data) + cmd_len - 1;
	vq->vring.desc[idx + 2].flags = VRING_DESC_F_WRITE;
	vq->vring.desc[idx + 2].next = 0;
	vq->vring.avail->ring[vq->vring.avail->idx % vq->vring.num] = idx;
	_mm_mfence();
	vq->vring.avail->idx++;
	_mm_mfence();

	virtio_legacy_notify_queue(dev, 2);
	_mm_mfence();

	// Wait until the buffer got processed
	while (vq->vq_used_last_idx == vq->vring.used->idx) {
		_mm_mfence();
		debug("Waiting...");
		usleep(100000);
	}
	vq->vq_used_last_idx++;
	// Check status and free buffer
	struct vring_used_elem* e = &vq->vring.used->ring[vq->vring.used->idx];
	debug("e %p: id %u len %u", e, e->id, e->len);
	if (e->id != idx) {
		error("Used buffer has different index as sent one");
	}
	if (vq->virtual_addresses[idx] != buf) {
		error("buffer differ");
	}
	pkt_buf_free(buf);
	vq->vring.desc[idx] = (struct vring_desc){};
	vq->vring.desc[idx + 1] = (struct vring_desc){};
	vq->vring.desc[idx + 2] = (struct vring_desc){};
}